

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void __thiscall CFG::toJSON(CFG *this,string *filename)

{
  pointer pbVar1;
  pointer pcVar2;
  Production *pPVar3;
  Ch *__s;
  size_t sVar4;
  pointer ppPVar5;
  pointer pbVar6;
  Value productionsRJ;
  Value terminalsRJ;
  Value alphabetRJ;
  Value strVal;
  Value productionsToRJ;
  Value strVal_3;
  ofstream myfile;
  Document document;
  undefined1 auStack_418 [8];
  CFG *local_410;
  long *local_408;
  SizeType local_400;
  long local_3f8 [2];
  long *local_3e8;
  SizeType local_3e0;
  long local_3d8 [2];
  long *local_3c8;
  SizeType local_3c0;
  long local_3b8 [2];
  long *local_3a8;
  SizeType local_3a0;
  long local_398 [2];
  Data local_388;
  Data local_378;
  Data local_368;
  string *local_350;
  pointer local_348;
  pointer local_340;
  long *local_338;
  SizeType local_330;
  long local_328 [2];
  undefined1 local_318 [16];
  CrtAllocator *pCStack_308;
  char *local_300;
  char *pcStack_2f8;
  char *local_2f0;
  size_t local_2e8;
  int local_2e0;
  bool local_2dc;
  Data local_2d8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  Data local_2a8;
  undefined1 local_298 [16];
  long local_288 [29];
  ios_base local_1a0 [264];
  Data local_98;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_88;
  
  local_350 = filename;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_98.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x3000000000000;
  if (local_88 != (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    local_368.n = (Number)0x0;
    local_368.s.str = (Ch *)0x4000000000000;
    pbVar6 = (this->nonTerminalsV).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->nonTerminalsV).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_410 = this;
    if (pbVar6 != pbVar1) {
      do {
        pcVar2 = (pbVar6->_M_dataplus)._M_p;
        local_298._0_8_ = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar2,pcVar2 + pbVar6->_M_string_length);
        local_3a8 = local_398;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_298._0_8_,(Ch *)(local_298._8_8_ + local_298._0_8_));
        local_318._0_8_ = (Number)0x0;
        local_318._8_8_ = (Ch *)0x0;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::SetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_318,(Ch *)local_3a8,local_3a0,local_88);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_368.s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_318,local_88);
        if (local_3a8 != local_398) {
          operator_delete(local_3a8,local_398[0] + 1);
        }
        if ((long *)local_298._0_8_ != local_288) {
          operator_delete((void *)local_298._0_8_,local_288[0] + 1);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar1);
    }
    local_298._8_8_ = (Ch *)0x405000000142ee6;
    local_298._0_8_ = (Number)0x9;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_298,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_368.s,local_88);
    local_378.n = (Number)0x0;
    local_378.s.str = (Ch *)0x4000000000000;
    pbVar6 = (local_410->terminalsT).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (local_410->terminalsT).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 != pbVar1) {
      do {
        pcVar2 = (pbVar6->_M_dataplus)._M_p;
        local_298._0_8_ = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar2,pcVar2 + pbVar6->_M_string_length);
        local_3c8 = local_3b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c8,local_298._0_8_,(Ch *)(local_298._8_8_ + local_298._0_8_));
        local_318._0_8_ = (Number)0x0;
        local_318._8_8_ = (Ch *)0x0;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::SetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_318,(Ch *)local_3c8,local_3c0,local_88);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_378.s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_318,local_88);
        if (local_3c8 != local_3b8) {
          operator_delete(local_3c8,local_3b8[0] + 1);
        }
        if ((long *)local_298._0_8_ != local_288) {
          operator_delete((void *)local_298._0_8_,local_288[0] + 1);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar1);
    }
    local_298._8_8_ = (Ch *)0x405000000142ef0;
    local_298._0_8_ = (Number)0x9;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_298,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_378.s,local_88);
    local_388.n = (Number)0x0;
    local_388.s.str = (Ch *)0x4000000000000;
    ppPVar5 = (local_410->productionsP).
              super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_348 = (local_410->productionsP).
                super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (ppPVar5 != local_348) {
      do {
        pPVar3 = *ppPVar5;
        local_318._0_8_ = (Number)0x0;
        local_318._8_8_ = (Ch *)0x3000000000000;
        local_408 = local_3f8;
        pcVar2 = (pPVar3->fromP)._M_dataplus._M_p;
        local_340 = ppPVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_408,pcVar2,pcVar2 + (pPVar3->fromP)._M_string_length);
        local_2d8.n = (Number)0x0;
        local_2d8.s.str = (Ch *)0x0;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::SetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_2d8.s,(Ch *)local_408,local_400,local_88);
        local_298._8_8_ = (Ch *)0x405000000142efa;
        local_298._0_8_ = (Number)0x4;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_318,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_298,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_2d8.s,local_88);
        if (local_408 != local_3f8) {
          operator_delete(local_408,local_3f8[0] + 1);
        }
        local_2d8.n.i64 = (Number)0x0;
        local_2d8.s.str = (Ch *)0x4000000000000;
        pbVar1 = (pPVar3->toP).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (pPVar3->toP).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          local_298._0_8_ = local_288;
          pcVar2 = (pbVar6->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_298,pcVar2,pcVar2 + pbVar6->_M_string_length);
          local_3e8 = local_3d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e8,local_298._0_8_,(Ch *)(local_298._8_8_ + local_298._0_8_))
          ;
          local_2a8.n.i64 = (Number)0x0;
          local_2a8.s.str = (Ch *)0x0;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::SetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_2a8.s,(Ch *)local_3e8,local_3e0,local_88);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_2d8.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_2a8.s,local_88);
          if (local_3e8 != local_3d8) {
            operator_delete(local_3e8,local_3d8[0] + 1);
          }
          if ((long *)local_298._0_8_ != local_288) {
            operator_delete((void *)local_298._0_8_,local_288[0] + 1);
          }
        }
        local_298._8_8_ = (Ch *)0x405000000142eff;
        local_298._0_8_ = (Number)0x4;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_318,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_298,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_2d8.s,local_88);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_388.s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_318,local_88);
        ppPVar5 = local_340 + 1;
      } while (ppPVar5 != local_348);
    }
    local_298._8_8_ = (Ch *)0x405000000142f04;
    local_298._0_8_ = (Number)0xb;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_298,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_388.s,local_88);
    pcVar2 = (local_410->startS)._M_dataplus._M_p;
    local_338 = local_328;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_338,pcVar2,pcVar2 + (local_410->startS)._M_string_length);
    local_318._0_8_ = (Number)0x0;
    local_318._8_8_ = (Ch *)0x0;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_318,(Ch *)local_338,local_330,local_88);
    local_298._8_8_ = (Ch *)0x405000000140510;
    local_298._0_8_ = (Number)0x5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_298,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_318,local_88);
    if (local_338 != local_328) {
      operator_delete(local_338,local_328[0] + 1);
    }
    local_318._0_8_ = &local_2d8;
    local_2b8 = 0;
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2d8.n = (Number)0x0;
    local_2d8.s.str = (Ch *)0x0;
    local_2b0 = 0x100;
    local_318._8_8_ = (Ch *)0x0;
    pCStack_308 = (CrtAllocator *)0x0;
    local_300 = (char *)0x0;
    pcStack_2f8 = (char *)0x0;
    local_2f0 = (char *)0x0;
    local_2e8 = 0x200;
    local_2e0 = 0x144;
    local_2dc = false;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&local_98.s,
               (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)local_318);
    std::ofstream::ofstream(local_298);
    std::ofstream::open((string *)local_298,(_Ios_Openmode)local_350);
    __s = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &local_2d8.s);
    if (__s == (Ch *)0x0) {
      std::ios::clear((int)auStack_418 + (int)*(undefined8 *)(local_298._0_8_ + -0x18) + 0x180);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,__s,sVar4);
    }
    std::ios::widen((char)(string *)local_298 + (char)*(undefined8 *)(local_298._0_8_ + -0x18));
    std::ostream::put((char)local_298);
    std::ostream::flush();
    std::ofstream::close();
    local_298._0_8_ = _VTT;
    *(undefined8 *)(local_298 + *(long *)(_VTT + -0x18)) = _memcpy;
    std::filebuf::~filebuf((filebuf *)(local_298 + 8));
    std::ios_base::~ios_base(local_1a0);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
              ((Stack<rapidjson::CrtAllocator> *)(local_318 + 8));
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
              ((Stack<rapidjson::CrtAllocator> *)&local_2d8.s);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)&local_98.s);
    return;
  }
  __assert_fail("allocator_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/document.h"
                ,0x96d,
                "Allocator &rapidjson::GenericDocument<rapidjson::UTF8<>>::GetAllocator() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

void CFG::toJSON(std::string filename) {
    // document is the root of a json message
    rapidjson::Document document;

    // define the document as an object rather than an array
    document.SetObject();

    // must pass an allocator when the object may need to allocate memory
    rapidjson::Document::AllocatorType &allocator = document.GetAllocator();

//    document.AddMember("type", "CFG", allocator);

    // create a rapidjson array type with similar syntax to std::vector
    // non-Terminals
    rapidjson::Value alphabetRJ(rapidjson::kArrayType);
    for (std::string character: nonTerminalsV) {
        alphabetRJ.PushBack(strJSON(character, allocator), allocator);
    }
    document.AddMember("Variables", alphabetRJ, allocator);

    // Terminals
    rapidjson::Value terminalsRJ(rapidjson::kArrayType);
    for (std::string character: terminalsT) {
        terminalsRJ.PushBack(strJSON(character, allocator), allocator);
    }
    document.AddMember("Terminals", terminalsRJ, allocator);


//    document.AddMember("eps", strJSON(string(1, epsilon), allocator), allocator);

    rapidjson::Value productionsRJ(rapidjson::kArrayType);
    for (Production *production: productionsP) {

        rapidjson::Value productionRJ(rapidjson::kObjectType);

        productionRJ.AddMember("head", strJSON(production->getFromP(), allocator), allocator);

        rapidjson::Value productionsToRJ(rapidjson::kArrayType);
        for (std::string productionElement: production->getToP()) {
            productionsToRJ.PushBack(strJSON(productionElement, allocator), allocator);
        }
        productionRJ.AddMember("body", productionsToRJ, allocator);
        productionsRJ.PushBack(productionRJ, allocator);
    }
    document.AddMember("Productions", productionsRJ, allocator);

    document.AddMember("Start", strJSON(startS, allocator), allocator);

    rapidjson::StringBuffer strbuf;
    rapidjson::Writer<rapidjson::StringBuffer> writer(strbuf);
    document.Accept(writer);

    // Source: s.n.(2019). Input/output with files. Visited on March 30, 2019 via http://www.cplusplus.com/doc/tutorial/files/
    // Yup, alweer diezelfde bron als altijd, ooit zal ik die 4 lijntjes wel vanbuiten kennen

    std::ofstream myfile;
    myfile.open(filename);

    myfile << strbuf.GetString() << std::endl;

    myfile.close();

}